

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O1

int st__foreach(st__table *table,_func_st__retval_char_ptr_char_ptr_char_ptr *func,char *arg)

{
  st__retval sVar1;
  st__table_entry **ppsVar2;
  long lVar3;
  st__table_entry *__ptr;
  
  if (0 < table->num_bins) {
    lVar3 = 0;
    do {
      __ptr = table->bins[lVar3];
      if (__ptr != (st__table_entry *)0x0) {
        ppsVar2 = table->bins + lVar3;
        do {
          sVar1 = (*func)(__ptr->key,__ptr->record,arg);
          if (sVar1 == st__CONTINUE) {
            ppsVar2 = &__ptr->next;
LAB_0049c41b:
            __ptr = *ppsVar2;
          }
          else {
            if (sVar1 == st__DELETE) {
              *ppsVar2 = __ptr->next;
              table->num_entries = table->num_entries + -1;
              free(__ptr);
              goto LAB_0049c41b;
            }
            if (sVar1 == st__STOP) {
              return 0;
            }
          }
        } while (__ptr != (st__table_entry *)0x0);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < table->num_bins);
  }
  return 1;
}

Assistant:

int
 st__foreach( st__table *table, enum st__retval (*func)(char *, char *, char *), char *arg)
{
    st__table_entry *ptr, **last;
    enum st__retval retval;
    int i;

    for(i = 0; i < table->num_bins; i++) {
    last = &table->bins[i]; ptr = *last;
    while (ptr != NULL) {
        retval = (*func)(ptr->key, ptr->record, arg);
        switch (retval) {
        case st__CONTINUE:
        last = &ptr->next; ptr = *last;
        break;
        case st__STOP:
        return 0;
        case st__DELETE:
        *last = ptr->next;
        table->num_entries--;   /* cstevens@ic */
        ABC_FREE(ptr);
        ptr = *last;
        }
    }
    }
    return 1;
}